

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O2

void t11(void)

{
  size_t __n;
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  void *__s1;
  
  uVar3 = al_ustr_new(anon_var_dwarf_3c4);
  uVar4 = al_ustr_new(anon_var_dwarf_3da);
  al_ustr_insert(uVar3,0x12,uVar4);
  pcVar5 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_1d8);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_32e);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_32e);
    error = error + 1;
  }
  al_ustr_insert(uVar4,3,uVar4);
  pcVar5 = (char *)al_cstr(uVar4);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_3e4);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_3fa);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_3fa);
    error = error + 1;
  }
  cVar1 = al_ustr_insert(uVar4,0xffffffffffffffff,uVar4);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n","!al_ustr_insert(us2, -1, us2)");
  }
  else {
    log_printf("FAIL %s\n","!al_ustr_insert(us2, -1, us2)");
    error = error + 1;
  }
  lVar6 = al_ustr_size(uVar4);
  al_ustr_insert(uVar4,(int)lVar6 + 3,uVar4);
  sVar7 = al_ustr_size(uVar4);
  __n = lVar6 * 2 + 3;
  if (sVar7 == __n) {
    log_printf("OK   %s\n","al_ustr_size(us2) == sz + sz + 3");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_size(us2) == sz + sz + 3");
    error = error + 1;
  }
  __s1 = (void *)al_cstr(uVar4);
  iVar2 = bcmp(__s1,anon_var_dwarf_424,__n);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_43a);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_43a);
    error = error + 1;
  }
  al_ustr_free(uVar3);
  al_ustr_free(uVar4);
  return;
}

Assistant:

static void t11(void)
{
   ALLEGRO_USTR *us1;
   ALLEGRO_USTR *us2;
   size_t sz;

   /* Insert in middle. */
   us1 = al_ustr_new("aábdðeéfghiíjkprstuúvxyýþæö");
   us2 = al_ustr_new("lmnoó");
   al_ustr_insert(us1, 18, us2);
   CHECK(0 == strcmp(al_cstr(us1), "aábdðeéfghiíjklmnoóprstuúvxyýþæö"));

   /* Insert into itself. */
   al_ustr_insert(us2, 3, us2);
   CHECK(0 == strcmp(al_cstr(us2), "lmnlmnoóoó"));

   /* Insert before start (not allowed). */
   CHECK(!al_ustr_insert(us2, -1, us2));

   /* Insert past end (will be padded with NULs). */
   sz = al_ustr_size(us2);
   al_ustr_insert(us2, sz + 3, us2);
   CHECK(al_ustr_size(us2) == sz + sz + 3);
   CHECK(0 == memcmp(al_cstr(us2), "lmnlmnoóoó\0\0\0lmnlmnoóoó", sz + sz + 3));

   al_ustr_free(us1);
   al_ustr_free(us2);
}